

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

int units::order(unit *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  unit_data local_14;
  int order;
  unit_data bd;
  unit *val_local;
  
  _order = val;
  local_14 = unit::base_units(val);
  iVar1 = detail::unit_data::meter(&local_14);
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar2 = detail::unit_data::kelvin(&local_14);
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  iVar3 = detail::unit_data::kg(&local_14);
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  iVar4 = detail::unit_data::count(&local_14);
  if (iVar4 < 1) {
    iVar4 = -iVar4;
  }
  iVar5 = detail::unit_data::ampere(&local_14);
  if (iVar5 < 1) {
    iVar5 = -iVar5;
  }
  iVar6 = detail::unit_data::second(&local_14);
  if (iVar6 < 1) {
    iVar6 = -iVar6;
  }
  iVar7 = detail::unit_data::currency(&local_14);
  if (iVar7 < 1) {
    iVar7 = -iVar7;
  }
  iVar8 = detail::unit_data::radian(&local_14);
  if (iVar8 < 1) {
    iVar8 = -iVar8;
  }
  iVar9 = detail::unit_data::candela(&local_14);
  if (iVar9 < 1) {
    iVar9 = -iVar9;
  }
  iVar10 = detail::unit_data::mole(&local_14);
  if (iVar10 < 1) {
    iVar10 = -iVar10;
  }
  return iVar1 + iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7 + iVar8 + iVar9 + iVar10;
}

Assistant:

static int order(const unit& val)
{
    auto bd = val.base_units();
    int order = std::labs(bd.meter()) + std::labs(bd.kelvin()) +
        std::labs(bd.kg()) + std::labs(bd.count()) + std::labs(bd.ampere()) +
        std::labs(bd.second()) + std::labs(bd.currency()) +
        std::labs(bd.radian()) + std::labs(bd.candela()) + std::labs(bd.mole());
    return order;
}